

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

void GETTOPVAL(char *string)

{
  LispPTR LAddr;
  LispPTR *local_28;
  LispPTR *cell68k;
  int index;
  char *string_local;
  
  LAddr = MAKEATOM(string);
  if (LAddr == 0xffffffff) {
    printf("\'%s\': no such symbol.\n",string);
  }
  else {
    if ((LAddr & 0xfff0000) == 0) {
      local_28 = (LispPTR *)(AtomSpace + (long)(int)(LAddr * 5) * 2);
    }
    else {
      local_28 = NativeAligned4FromLAddr(LAddr);
    }
    local_28 = local_28 + 1;
    print(*local_28);
  }
  return;
}

Assistant:

void GETTOPVAL(char *string) {
  int index;
  LispPTR *cell68k;

  index = MAKEATOM(string);
  if (index != -1) /* Only print if there's such an atom */
  {
    cell68k = (LispPTR *)GetVALCELL68k(index);
    print(*cell68k);
  } else
    printf("'%s': no such symbol.\n", string);
}